

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

uint16_t __thiscall
VmaBlockMetadata_TLSF::SizeToSecondIndex
          (VmaBlockMetadata_TLSF *this,VkDeviceSize size,uint8_t memoryClass)

{
  bool bVar1;
  char in_DL;
  ulong in_RSI;
  VmaBlockMetadata *in_RDI;
  undefined2 local_2;
  
  if (in_DL == '\0') {
    bVar1 = VmaBlockMetadata::IsVirtual(in_RDI);
    if (bVar1) {
      local_2 = (ushort)(in_RSI - 1 >> 3);
    }
    else {
      local_2 = (ushort)(in_RSI - 1 >> 6);
    }
  }
  else {
    local_2 = (ushort)(in_RSI >> (in_DL + 2U & 0x3f)) ^ 0x20;
  }
  return local_2;
}

Assistant:

uint16_t VmaBlockMetadata_TLSF::SizeToSecondIndex(VkDeviceSize size, uint8_t memoryClass) const
{
    if (memoryClass == 0)
    {
        if (IsVirtual())
            return static_cast<uint16_t>((size - 1) / 8);
        else
            return static_cast<uint16_t>((size - 1) / 64);
    }
    return static_cast<uint16_t>((size >> (memoryClass + MEMORY_CLASS_SHIFT - SECOND_LEVEL_INDEX)) ^ (1U << SECOND_LEVEL_INDEX));
}